

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_suite.cpp
# Opt level: O0

void reverse_real(void)

{
  type v;
  double local_80;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  std::reverse<trial::dynamic::basic_variable<std::allocator<char>>::iterator>(&local_50,&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  local_80 = 3.0;
  v = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_38,&local_80);
  boost::detail::test_impl
            ("data == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/reverse_suite.cpp"
             ,0x2e,"void reverse_real()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void reverse_real()
{
    variable data = 3.0;
    std::reverse(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST(data == 3.0);
}